

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineLimitTests.cpp
# Opt level: O1

void __thiscall
agge::tests::LimitEllipsisTests::
GlyphIndexAndExtentAreLatchedForTheStyleAtWhichCandidatePositionIsFound(LimitEllipsisTests *this)

{
  state *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  FailedAssertion *this_01;
  char *i;
  ellipsis e;
  layout_builder b;
  state referenceTrimmed [1];
  pair<unsigned_long,_std::pair<unsigned_int,_float>_> reference [3];
  char *local_150;
  ellipsis local_144;
  string local_120;
  LocationInfo local_100;
  layout_builder local_d8;
  state local_90;
  string local_88;
  pair<unsigned_long,_std::pair<unsigned_int,_float>_> local_68;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  
  local_d8.ellipsis_codepoint = 0x2026;
  local_d8.ellipsis_symbol.first = 0x8b;
  local_d8.ellipsis_symbol.second = 3.71;
  local_d8.trimmed_at.
  super__Vector_base<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.trimmed_at.
  super__Vector_base<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.trimmed_at.
  super__Vector_base<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.appended.
  super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.appended.
  super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.appended.
  super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.state.extent = 0.0;
  local_d8.state.next = 0;
  local_150 = "foobar";
  local_144._limit = 50.0;
  local_144._symbol_codepoint = 0x2026;
  local_144._at.extent = 0.0;
  local_144._at.next = 0;
  local_144._symbol.first = 0;
  local_144._symbol.second = 0.0;
  local_144._at_symbol.first = 0;
  local_144._at_symbol.second = 0.0;
  local_144._stop = false;
  local_144._symbol = mocks::layout_builder::current_glyph(&local_d8,0x2026);
  this_00 = &local_144._at;
  local_d8.state.extent = 45.29;
  local_d8.state.next = 10;
  if (local_144._stop == true) {
LAB_001669c8:
    local_150 = "oobar";
  }
  else {
    if ((local_144._symbol.second + 45.29 <= local_144._limit) &&
       (local_144._limit < local_144._symbol.second + 45.29 + 1.0)) {
      local_144._at.extent = 45.29;
      local_144._at.next = 10;
      local_144._at_symbol = local_144._symbol;
    }
    if (46.29 < local_144._limit) {
      mocks::layout_builder::append_glyph(&local_d8,0x17,1.0);
      goto LAB_001669c8;
    }
    bVar3 = layout_builder::state::operator!(this_00);
    if (!bVar3) {
      limit::ellipsis::trim<agge::tests::mocks::layout_builder,char_const*>
                (&local_144,&local_d8,&local_150,"oobar");
    }
  }
  if (local_144._stop == true) {
LAB_00166a4f:
    local_150 = "obar";
  }
  else {
    if ((local_d8.state.extent + local_144._symbol.second <= local_144._limit) &&
       (local_144._limit < local_d8.state.extent + local_144._symbol.second + 1.0)) {
      local_144._at = local_d8.state;
      local_144._at_symbol = local_144._symbol;
    }
    if (local_d8.state.extent + 1.0 < local_144._limit) {
      mocks::layout_builder::append_glyph(&local_d8,0x18,1.0);
      goto LAB_00166a4f;
    }
    bVar3 = layout_builder::state::operator!(this_00);
    if (!bVar3) {
      limit::ellipsis::trim<agge::tests::mocks::layout_builder,char_const*>
                (&local_144,&local_d8,&local_150,"obar");
    }
  }
  local_d8.ellipsis_symbol.first = 0x65;
  local_d8.ellipsis_symbol.second = 2.9;
  local_144._symbol = mocks::layout_builder::current_glyph(&local_d8,local_144._symbol_codepoint);
  if (local_144._stop != true) {
    if ((local_d8.state.extent + local_144._symbol.second <= local_144._limit) &&
       (local_144._limit < local_d8.state.extent + local_144._symbol.second + 2.8)) {
      local_144._at = local_d8.state;
      local_144._at_symbol = local_144._symbol;
    }
    if (local_144._limit <= local_d8.state.extent + 2.8) {
      bVar3 = layout_builder::state::operator!(this_00);
      if (!bVar3) {
        limit::ellipsis::trim<agge::tests::mocks::layout_builder,char_const*>
                  (&local_144,&local_d8,&local_150,"bar");
      }
      goto LAB_00166b02;
    }
    mocks::layout_builder::append_glyph(&local_d8,0x19,2.8);
  }
  local_150 = "bar";
LAB_00166b02:
  local_68.first = 10;
  local_68.second.first = 0x17;
  local_68.second.second = 1.0;
  local_58 = 0xb;
  local_50 = 0x3f80000000000018;
  local_48 = 0xb;
  local_40 = 0x406d70a40000008b;
  local_90.extent = 46.29;
  local_90.next = 0xb;
  paVar1 = &local_120.field_2;
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_120,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LineLimitTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_100,&local_120,0x152);
  ut::
  are_equal<std::pair<unsigned_long,std::pair<unsigned_int,float>>,3ul,std::vector<std::pair<unsigned_long,std::pair<unsigned_int,float>>,std::allocator<std::pair<unsigned_long,std::pair<unsigned_int,float>>>>>
            ((pair<unsigned_long,_std::pair<unsigned_int,_float>_> (*) [3])&local_68,
             &local_d8.appended,&local_100);
  paVar2 = &local_100.filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_100.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_120,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LineLimitTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_100,&local_120,0x153);
  ut::
  are_equal<agge::layout_builder::state,1ul,std::vector<agge::layout_builder::state,std::allocator<agge::layout_builder::state>>>
            ((state (*) [1])&local_90,&local_d8.trimmed_at,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_100.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LineLimitTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_100,&local_88,0x154);
  if (local_150 == "bar") {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.filename._M_dataplus._M_p != paVar2) {
      operator_delete(local_100.filename._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if (local_d8.appended.
        super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.appended.
                      super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_d8.trimmed_at.
        super__Vector_base<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.trimmed_at.
                      super__Vector_base<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  this_01 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"Values are not equal!","");
  ut::FailedAssertion::FailedAssertion(this_01,&local_120,&local_100);
  __cxa_throw(this_01,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
}

Assistant:

test( GlyphIndexAndExtentAreLatchedForTheStyleAtWhichCandidatePositionIsFound )
			{
				// INIT
				mocks::layout_builder b;
				const char *const begin = "foobar", *const end = begin + 6;
				const char *i = begin;
				limit::ellipsis e(50.0f);

				e.begin_style(b);
				b.state.extent = 50.0f - 4.71f;
				b.state.next = 10;
				e.add_glyph(b, 23, 1.0f, i, begin + 1, end);
				// <- in here the ellipsis will be appended after the trimming
				e.add_glyph(b, 24, 1.0f, i, begin + 2, end);
				b.ellipsis_symbol.first = 101;
				b.ellipsis_symbol.second = 2.9f;
				e.begin_style(b);

				// ACT
				e.add_glyph(b, 25, 2.8f, i, begin + 3, end);

				// ASSERT
				pair<size_t, pair<glyph_index_t, real_t> > reference[] = {
					make_pair(10u, make_pair(23u, 1.0f)),
					make_pair(11u, make_pair(24u, 1.0f)),
					make_pair(11u, make_pair(139u, 3.71f)), // despite the last ellipsis was 101, 2.9f, we set the previous.
				};
				layout_builder::state referenceTrimmed[] = {	{	46.29f, 11u	}	};

				assert_equal(reference, b.appended);
				assert_equal(referenceTrimmed, b.trimmed_at);
				assert_equal(begin + 3, i);
			}